

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_sse2.c
# Opt level: O0

void AddGreenToBlueAndRed_SSE2(uint32_t *src,int num_pixels,uint32_t *dst)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  undefined1 auVar4 [16];
  __m128i out;
  __m128i C;
  __m128i B;
  __m128i A;
  __m128i in;
  int i;
  int local_7c;
  ushort local_58;
  ushort uStack_56;
  ushort uStack_54;
  ushort uStack_52;
  ushort uStack_50;
  ushort uStack_4e;
  ushort uStack_4c;
  ushort uStack_4a;
  char local_28;
  char cStack_27;
  char cStack_26;
  char cStack_25;
  char cStack_24;
  char cStack_23;
  char cStack_22;
  char cStack_21;
  char cStack_20;
  char cStack_1f;
  char cStack_1e;
  char cStack_1d;
  char cStack_1c;
  char cStack_1b;
  char cStack_1a;
  char cStack_19;
  char local_18;
  char cStack_17;
  char cStack_16;
  char cStack_15;
  char cStack_14;
  char cStack_13;
  char cStack_12;
  char cStack_11;
  char cStack_10;
  char cStack_f;
  char cStack_e;
  char cStack_d;
  char cStack_c;
  char cStack_b;
  char cStack_a;
  char cStack_9;
  
  for (local_7c = 0; local_7c + 4 <= in_ESI; local_7c = local_7c + 4) {
    puVar3 = (undefined8 *)(in_RDI + (long)local_7c * 4);
    uVar1 = *puVar3;
    uVar2 = puVar3[1];
    local_58 = (ushort)uVar1;
    uStack_56 = (ushort)((ulong)uVar1 >> 0x10);
    uStack_54 = (ushort)((ulong)uVar1 >> 0x20);
    uStack_50 = (ushort)uVar2;
    uStack_4e = (ushort)((ulong)uVar2 >> 0x10);
    uStack_4c = (ushort)((ulong)uVar2 >> 0x20);
    auVar4._2_2_ = uStack_56 >> 8;
    auVar4._0_2_ = local_58 >> 8;
    auVar4._4_2_ = uStack_54 >> 8;
    auVar4._6_2_ = (ushort)((ulong)uVar1 >> 0x38);
    auVar4._8_2_ = uStack_50 >> 8;
    auVar4._10_2_ = uStack_4e >> 8;
    auVar4._12_2_ = uStack_4c >> 8;
    auVar4._14_2_ = (ushort)((ulong)uVar2 >> 0x38);
    auVar4 = pshuflw(auVar4,auVar4,0xa0);
    auVar4 = pshufhw(auVar4,auVar4,0xa0);
    local_18 = (char)uVar1;
    cStack_17 = (char)((ulong)uVar1 >> 8);
    cStack_16 = (char)((ulong)uVar1 >> 0x10);
    cStack_15 = (char)((ulong)uVar1 >> 0x18);
    cStack_14 = (char)((ulong)uVar1 >> 0x20);
    cStack_13 = (char)((ulong)uVar1 >> 0x28);
    cStack_12 = (char)((ulong)uVar1 >> 0x30);
    cStack_11 = (char)((ulong)uVar1 >> 0x38);
    cStack_10 = (char)uVar2;
    cStack_f = (char)((ulong)uVar2 >> 8);
    cStack_e = (char)((ulong)uVar2 >> 0x10);
    cStack_d = (char)((ulong)uVar2 >> 0x18);
    cStack_c = (char)((ulong)uVar2 >> 0x20);
    cStack_b = (char)((ulong)uVar2 >> 0x28);
    cStack_a = (char)((ulong)uVar2 >> 0x30);
    cStack_9 = (char)((ulong)uVar2 >> 0x38);
    local_28 = auVar4[0];
    cStack_27 = auVar4[1];
    cStack_26 = auVar4[2];
    cStack_25 = auVar4[3];
    cStack_24 = auVar4[4];
    cStack_23 = auVar4[5];
    cStack_22 = auVar4[6];
    cStack_21 = auVar4[7];
    cStack_20 = auVar4[8];
    cStack_1f = auVar4[9];
    cStack_1e = auVar4[10];
    cStack_1d = auVar4[0xb];
    cStack_1c = auVar4[0xc];
    cStack_1b = auVar4[0xd];
    cStack_1a = auVar4[0xe];
    cStack_19 = auVar4[0xf];
    puVar3 = (undefined8 *)(in_RDX + (long)local_7c * 4);
    *puVar3 = CONCAT17(cStack_11 + cStack_21,
                       CONCAT16(cStack_12 + cStack_22,
                                CONCAT15(cStack_13 + cStack_23,
                                         CONCAT14(cStack_14 + cStack_24,
                                                  CONCAT13(cStack_15 + cStack_25,
                                                           CONCAT12(cStack_16 + cStack_26,
                                                                    CONCAT11(cStack_17 + cStack_27,
                                                                             local_18 + local_28))))
                                        )));
    puVar3[1] = CONCAT17(cStack_9 + cStack_19,
                         CONCAT16(cStack_a + cStack_1a,
                                  CONCAT15(cStack_b + cStack_1b,
                                           CONCAT14(cStack_c + cStack_1c,
                                                    CONCAT13(cStack_d + cStack_1d,
                                                             CONCAT12(cStack_e + cStack_1e,
                                                                      CONCAT11(cStack_f + cStack_1f,
                                                                               cStack_10 + cStack_20
                                                                              )))))));
  }
  if (local_7c != in_ESI) {
    VP8LAddGreenToBlueAndRed_C
              ((uint32_t *)(in_RDI + (long)local_7c * 4),in_ESI - local_7c,
               (uint32_t *)(in_RDX + (long)local_7c * 4));
  }
  return;
}

Assistant:

static void AddGreenToBlueAndRed_SSE2(const uint32_t* const src, int num_pixels,
                                      uint32_t* dst) {
  int i;
  for (i = 0; i + 4 <= num_pixels; i += 4) {
    const __m128i in = _mm_loadu_si128((const __m128i*)&src[i]); // argb
    const __m128i A = _mm_srli_epi16(in, 8);     // 0 a 0 g
    const __m128i B = _mm_shufflelo_epi16(A, _MM_SHUFFLE(2, 2, 0, 0));
    const __m128i C = _mm_shufflehi_epi16(B, _MM_SHUFFLE(2, 2, 0, 0));  // 0g0g
    const __m128i out = _mm_add_epi8(in, C);
    _mm_storeu_si128((__m128i*)&dst[i], out);
  }
  // fallthrough and finish off with plain-C
  if (i != num_pixels) {
    VP8LAddGreenToBlueAndRed_C(src + i, num_pixels - i, dst + i);
  }
}